

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::cose::Sign1Message::Validate
          (Error *__return_storage_ptr__,Sign1Message *this,CborMap *aCborPublicKey)

{
  char cVar1;
  cn_cbor *pKey;
  _Bool _Var2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  writer write;
  string local_a0;
  undefined1 local_80 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pKey = (aCborPublicKey->super_CborValue).mCbor;
  if (pKey == (cn_cbor *)0x0) {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "validate COSE SIGN1 message with invalid public key";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "validate COSE SIGN1 message with invalid public key";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar3,"");
          goto LAB_001c8798;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",&local_58);
    }
LAB_001c8798:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"validate COSE SIGN1 message with invalid public key",
               (string_view)ZEXT816(0x33),args);
    local_80._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
  }
  else {
    _Var2 = COSE_Sign0_validate(this->mSign,pKey,(cose_errback *)0x0);
    if (_Var2) {
      return __return_storage_ptr__;
    }
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "validate COSE SIGN1 message failed";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x22;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "validate COSE SIGN1 message failed";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (pcVar3 != "") {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar3,"");
          goto LAB_001c87e1;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",&local_58);
    }
LAB_001c87e1:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"validate COSE SIGN1 message failed",(string_view)ZEXT816(0x22),
               args_00);
    local_80._0_4_ = kSecurity;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_80);
  std::__cxx11::string::~string((string *)(local_80 + 8));
  std::__cxx11::string::~string((string *)&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::Validate(const CborMap &aCborPublicKey)
{
    Error error;

    VerifyOrExit(aCborPublicKey.IsValid(),
                 error = ERROR_INVALID_ARGS("validate COSE SIGN1 message with invalid public key"));

    VerifyOrExit(COSE_Sign0_validate(mSign, aCborPublicKey.GetImpl(), nullptr),
                 error = ERROR_SECURITY("validate COSE SIGN1 message failed"));

exit:
    return error;
}